

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::DoRevisionSVN
          (cmCTestSVN *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  __type _Var1;
  bool bVar2;
  ulong uVar3;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes_local;
  Revision *revision_local;
  cmCTestSVN *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) &&
     (bVar2 = std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::empty
                        (changes), !bVar2)) {
    GuessBase(this,this->RootInfo,changes);
  }
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          revision,&revision->SVNInfo->OldRevision);
  if ((!_Var1) || (bVar2 = std::operator!=(&revision->SVNInfo->LocalPath,""), !bVar2)) {
    cmCTestGlobalVC::DoRevision(&this->super_cmCTestGlobalVC,&revision->super_Revision,changes);
  }
  return;
}

Assistant:

void cmCTestSVN::DoRevisionSVN(Revision const& revision,
                               std::vector<Change> const& changes)
{
  // Guess the base checkout path from the changes if necessary.
  if(this->RootInfo->Base.empty() && !changes.empty())
    {
    this->GuessBase(*this->RootInfo, changes);
    }

  // Ignore changes in the old revision for external repositories
  if(revision.Rev == revision.SVNInfo->OldRevision
     && revision.SVNInfo->LocalPath != "")
    {
    return;
    }

  this->cmCTestGlobalVC::DoRevision(revision, changes);
}